

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-digits.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  size_t sVar2;
  FILE *pFVar3;
  undefined4 in_register_0000003c;
  char *pcVar4;
  long lVar5;
  double dVar6;
  float local_4c;
  Settings local_48;
  char *local_38;
  
  name = *argv;
  local_48.delay = 0.0;
  local_48.output = (FILE *)_stdout;
  iVar1 = __posix_getopt(CONCAT44(in_register_0000003c,argc),argv,"d:o:");
  if (iVar1 != -1) {
    local_4c = local_48.delay;
    pFVar3 = (FILE *)local_48.output;
    do {
      local_38 = (char *)0x0;
      if (iVar1 == 0x6f) {
        if (pFVar3 != _stdout) {
          fclose(pFVar3);
        }
        pFVar3 = fopen(_optarg,"w");
      }
      else {
        if (iVar1 != 100) {
          local_48.delay = local_4c;
          local_48.output = (FILE *)pFVar3;
          fprintf(_stdout,"USAGE: %s [-d DELAY] [-o OUTPUTFILE] [FILE]...\n",name);
          goto LAB_001014cf;
        }
        dVar6 = strtod(_optarg,&local_38);
        pcVar4 = _optarg;
        local_4c = (float)dVar6;
        sVar2 = strlen(_optarg);
        if (pcVar4 + sVar2 != local_38) {
          local_48.delay = local_4c;
          local_48.output = (FILE *)pFVar3;
          fprintf(_stderr,"%s ERROR:\t",name);
          pcVar4 = "d value is not a valid double";
          sVar2 = 0x1d;
          goto LAB_001014b8;
        }
      }
      iVar1 = __posix_getopt(argc,argv,"d:o:");
    } while (iVar1 != -1);
    local_48.delay = local_4c;
    local_48.output = (FILE *)pFVar3;
  }
  iVar1 = _optind;
  if ((FILE *)local_48.output != (FILE *)0x0) {
    if (argc == _optind) {
      handle_file(_stdin,&local_48);
    }
    if (iVar1 < argc) {
      lVar5 = 0;
      do {
        pFVar3 = fopen(argv[iVar1 + lVar5],"r");
        if (pFVar3 == (FILE *)0x0) {
          fprintf(_stderr,"%s ERROR:\t",name);
          fprintf(_stderr,"couldn\'t open file %s",argv[iVar1 + lVar5]);
          fputc(10,_stderr);
        }
        else {
          handle_file((FILE *)pFVar3,&local_48);
          fclose(pFVar3);
        }
        lVar5 = lVar5 + 1;
      } while (argc - iVar1 != (int)lVar5);
    }
    exit(0);
  }
  fprintf(_stderr,"%s ERROR:\t",name);
  pcVar4 = "couldn\'t open output file";
  sVar2 = 0x19;
LAB_001014b8:
  fwrite(pcVar4,sVar2,1,_stderr);
  fputc(10,_stderr);
LAB_001014cf:
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
    name = argv[0];

    Settings set = {0, stdout};
    int i = handle_arguments(argc, argv, &set);

    if (i == argc)
    {
        handle_file(stdin, &set);
    }
    for (; i < argc; i++)
    {
        FILE *input = fopen(argv[i], "r");
        if (input == NULL)
        {
            ERROR_MSG("couldn't open file %s", argv[i]);
            continue;
        }
        handle_file(input, &set);
        fclose(input);
    }

    exit(EXIT_SUCCESS);
}